

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseEmitter::commentf(BaseEmitter *this,char *fmt,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Error _err;
  Error err;
  va_list ap;
  StringTmp<1024UL> sb;
  undefined4 in_stack_fffffffffffffa38;
  Error in_stack_fffffffffffffa3c;
  char *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  Error err_00;
  BaseEmitter *in_stack_fffffffffffffa50;
  undefined1 local_588 [16];
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_548;
  undefined8 local_538;
  undefined8 local_528;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined4 local_4c4;
  Error local_4c0;
  Error local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  StringTmp<1024UL> local_4a0;
  undefined1 auStack_49f [7];
  ulong local_498;
  undefined1 *local_488;
  __va_list_tag *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  ModifyOp in_stack_fffffffffffffed4;
  String *in_stack_fffffffffffffed8;
  Error local_68;
  
  err_00 = (Error)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  if (in_AL != '\0') {
    local_558 = in_XMM0_Qa;
    local_548 = in_XMM1_Qa;
    local_538 = in_XMM2_Qa;
    local_528 = in_XMM3_Qa;
    local_518 = in_XMM4_Qa;
    local_508 = in_XMM5_Qa;
    local_4f8 = in_XMM6_Qa;
    local_4e8 = in_XMM7_Qa;
  }
  local_578 = in_RDX;
  local_570 = in_RCX;
  local_568 = in_R8;
  local_560 = in_R9;
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (*(EmitterFlags *)((long)in_RDI + 9),kLogComments);
  if (bVar1) {
    memset(&local_4a0,0,0x20);
    StringTmp<1024UL>::_resetToTemporary(&local_4a0);
    local_4a8 = local_588;
    local_4b0 = &stack0x00000008;
    local_4b4 = 0x30;
    local_4b8 = 0x10;
    local_4c0 = String::_opVFormat(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    local_4bc = local_4c0;
    local_68 = local_4c0;
    if (local_4c0 == 0) {
      if ((byte)local_4a0 < 0x1f) {
        local_488 = auStack_49f;
        local_498 = (ulong)(byte)local_4a0;
      }
      in_stack_fffffffffffffa3c = (**(code **)(*in_RDI + 0x78))(in_RDI,local_488,local_498);
      local_68 = in_stack_fffffffffffffa3c;
    }
    local_4c4 = 1;
    StringTmp<1024UL>::~StringTmp
              ((StringTmp<1024UL> *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  else {
    bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                      (*(EmitterFlags *)((long)in_RDI + 9),kAttached);
    if (bVar1) {
      local_68 = 0;
    }
    else {
      DebugUtils::errored(5);
      local_68 = reportError(in_stack_fffffffffffffa50,err_00,in_stack_fffffffffffffa40);
    }
  }
  return local_68;
}

Assistant:

Error BaseEmitter::commentf(const char* fmt, ...) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;

  va_list ap;
  va_start(ap, fmt);
  Error err = sb.appendVFormat(fmt, ap);
  va_end(ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt);
  return kErrorOk;
#endif
}